

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O3

AMQP_VALUE amqpvalue_create_composite_with_ulong_descriptor(uint64_t descriptor)

{
  undefined4 *__ptr;
  AMQP_VALUE value;
  AMQP_VALUE pAVar1;
  LOGGER_LOG p_Var2;
  
  __ptr = (undefined4 *)malloc(0x20);
  if (__ptr == (undefined4 *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                ,"amqpvalue_create_composite_with_ulong_descriptor",0x1c67,1,
                "Cannot allocate memory for composite type");
      return (AMQP_VALUE)0x0;
    }
  }
  else {
    *__ptr = 1;
    value = amqpvalue_create_ulong(descriptor);
    if (value == (AMQP_VALUE)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                  ,"amqpvalue_create_composite_with_ulong_descriptor",0x1c6e,1,
                  "Cannot create ulong descriptor for composite type");
      }
    }
    else {
      __ptr[2] = 0x17;
      *(AMQP_VALUE *)(__ptr + 4) = value;
      pAVar1 = amqpvalue_create_list();
      *(AMQP_VALUE *)(__ptr + 6) = pAVar1;
      if (pAVar1 != (AMQP_VALUE)0x0) {
        return (AMQP_VALUE)(__ptr + 2);
      }
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                  ,"amqpvalue_create_composite_with_ulong_descriptor",0x1c79,1,
                  "Cannot create list for composite type");
      }
      amqpvalue_destroy(value);
    }
    free(__ptr);
  }
  return (AMQP_VALUE)0x0;
}

Assistant:

AMQP_VALUE amqpvalue_create_composite_with_ulong_descriptor(uint64_t descriptor)
{
    AMQP_VALUE_DATA* result = (AMQP_VALUE_DATA*)REFCOUNT_TYPE_CREATE(AMQP_VALUE_DATA);
    if (result == NULL)
    {
        LogError("Cannot allocate memory for composite type");
    }
    else
    {
        AMQP_VALUE descriptor_ulong_value = amqpvalue_create_ulong(descriptor);
        if (descriptor_ulong_value == NULL)
        {
            LogError("Cannot create ulong descriptor for composite type");
            REFCOUNT_TYPE_DESTROY(AMQP_VALUE_DATA, result);
            result = NULL;
        }
        else
        {
            result->type = AMQP_TYPE_COMPOSITE;
            result->value.described_value.descriptor = descriptor_ulong_value;
            result->value.described_value.value = amqpvalue_create_list();
            if (result->value.described_value.value == NULL)
            {
                LogError("Cannot create list for composite type");
                amqpvalue_destroy(descriptor_ulong_value);
                REFCOUNT_TYPE_DESTROY(AMQP_VALUE_DATA, result);
                result = NULL;
            }
        }
    }

    return result;
}